

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void MeCab::replace_string(string *s,string *src,string *dst)

{
  ulong uVar1;
  
  uVar1 = std::__cxx11::string::find((char *)s,(ulong)(src->_M_dataplus)._M_p,0);
  if (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)s,uVar1,(char *)src->_M_string_length,(ulong)(dst->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

void replace_string(std::string *s,
                    const std::string &src,
                    const std::string &dst) {
  const std::string::size_type pos = s->find(src);
  if (pos != std::string::npos) {
    s->replace(pos, src.size(), dst);
  }
}